

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O2

long asn1_string_get_long(ASN1_STRING *a,int type)

{
  int iVar1;
  int64_t in_RAX;
  int64_t v;
  
  if (a == (ASN1_STRING *)0x0) {
    return 0;
  }
  v = in_RAX;
  iVar1 = asn1_string_get_int64(&v,a,type);
  if (iVar1 == 0) {
    ERR_clear_error();
    v = -1;
  }
  return v;
}

Assistant:

static long asn1_string_get_long(const ASN1_STRING *a, int type) {
  if (a == NULL) {
    return 0;
  }

  int64_t v;
  if (!asn1_string_get_int64(&v, a, type) ||  //
      v < LONG_MIN || v > LONG_MAX) {
    // This function's return value does not distinguish overflow from -1.
    ERR_clear_error();
    return -1;
  }

  return (long)v;
}